

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int onig_is_code_in_cc(OnigEncoding enc,OnigCodePoint code,CClassNode *cc)

{
  int iVar1;
  
  if (enc->min_enc_len < 2) {
    iVar1 = (*enc->code_to_mbclen)(code);
    if (iVar1 < 0) {
      return 0;
    }
  }
  else {
    iVar1 = 2;
  }
  iVar1 = onig_is_code_in_cc_len(iVar1,code,cc);
  return iVar1;
}

Assistant:

extern int
onig_is_code_in_cc(OnigEncoding enc, OnigCodePoint code, CClassNode* cc)
{
  int len;

  if (ONIGENC_MBC_MINLEN(enc) > 1) {
    len = 2;
  }
  else {
    len = ONIGENC_CODE_TO_MBCLEN(enc, code);
    if (len < 0) return 0;
  }
  return onig_is_code_in_cc_len(len, code, cc);
}